

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O3

void PredictorSub12_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  undefined1 auVar39 [15];
  unkuint9 Var40;
  undefined1 auVar41 [11];
  undefined1 auVar42 [15];
  unkuint9 Var43;
  undefined1 auVar44 [11];
  undefined1 auVar45 [15];
  unkuint9 Var46;
  undefined1 auVar47 [11];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  uint32_t uVar54;
  uint32_t uVar55;
  uint32_t uVar56;
  int iVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  
  uVar60 = 0;
  if (3 < num_pixels) {
    uVar59 = 0;
    do {
      auVar3 = *(undefined1 (*) [16])(in + (uVar59 - 1));
      puVar1 = in + uVar59;
      cVar27 = *(char *)((long)puVar1 + 1);
      cVar28 = *(char *)((long)puVar1 + 2);
      cVar29 = *(char *)((long)puVar1 + 3);
      uVar54 = puVar1[1];
      cVar30 = *(char *)((long)puVar1 + 5);
      cVar31 = *(char *)((long)puVar1 + 6);
      cVar32 = *(char *)((long)puVar1 + 7);
      uVar55 = puVar1[2];
      cVar33 = *(char *)((long)puVar1 + 9);
      cVar34 = *(char *)((long)puVar1 + 10);
      cVar35 = *(char *)((long)puVar1 + 0xb);
      uVar56 = puVar1[3];
      cVar36 = *(char *)((long)puVar1 + 0xd);
      cVar37 = *(char *)((long)puVar1 + 0xe);
      cVar38 = *(char *)((long)puVar1 + 0xf);
      auVar6[0xd] = 0;
      auVar6._0_13_ = auVar3._0_13_;
      auVar6[0xe] = auVar3[7];
      auVar9[0xc] = auVar3[6];
      auVar9._0_12_ = auVar3._0_12_;
      auVar9._13_2_ = auVar6._13_2_;
      auVar12[0xb] = 0;
      auVar12._0_11_ = auVar3._0_11_;
      auVar12._12_3_ = auVar9._12_3_;
      auVar15[10] = auVar3[5];
      auVar15._0_10_ = auVar3._0_10_;
      auVar15._11_4_ = auVar12._11_4_;
      auVar18[9] = 0;
      auVar18._0_9_ = auVar3._0_9_;
      auVar18._10_5_ = auVar15._10_5_;
      auVar21[8] = auVar3[4];
      auVar21._0_8_ = auVar3._0_8_;
      auVar21._9_6_ = auVar18._9_6_;
      auVar39._7_8_ = 0;
      auVar39._0_7_ = auVar21._8_7_;
      Var40 = CONCAT81(SUB158(auVar39 << 0x40,7),auVar3[3]);
      auVar48._9_6_ = 0;
      auVar48._0_9_ = Var40;
      auVar41._1_10_ = SUB1510(auVar48 << 0x30,5);
      auVar41[0] = auVar3[2];
      auVar49._11_4_ = 0;
      auVar49._0_11_ = auVar41;
      auVar24[2] = auVar3[1];
      auVar24._0_2_ = auVar3._0_2_;
      auVar24._3_12_ = SUB1512(auVar49 << 0x20,3);
      auVar4 = *(undefined1 (*) [16])(upper + (uVar59 - 1));
      auVar5 = *(undefined1 (*) [16])(upper + uVar59);
      auVar7[0xd] = 0;
      auVar7._0_13_ = auVar5._0_13_;
      auVar7[0xe] = auVar5[7];
      auVar10[0xc] = auVar5[6];
      auVar10._0_12_ = auVar5._0_12_;
      auVar10._13_2_ = auVar7._13_2_;
      auVar13[0xb] = 0;
      auVar13._0_11_ = auVar5._0_11_;
      auVar13._12_3_ = auVar10._12_3_;
      auVar16[10] = auVar5[5];
      auVar16._0_10_ = auVar5._0_10_;
      auVar16._11_4_ = auVar13._11_4_;
      auVar19[9] = 0;
      auVar19._0_9_ = auVar5._0_9_;
      auVar19._10_5_ = auVar16._10_5_;
      auVar22[8] = auVar5[4];
      auVar22._0_8_ = auVar5._0_8_;
      auVar22._9_6_ = auVar19._9_6_;
      auVar42._7_8_ = 0;
      auVar42._0_7_ = auVar22._8_7_;
      Var43 = CONCAT81(SUB158(auVar42 << 0x40,7),auVar5[3]);
      auVar50._9_6_ = 0;
      auVar50._0_9_ = Var43;
      auVar44._1_10_ = SUB1510(auVar50 << 0x30,5);
      auVar44[0] = auVar5[2];
      auVar51._11_4_ = 0;
      auVar51._0_11_ = auVar44;
      auVar25[2] = auVar5[1];
      auVar25._0_2_ = auVar5._0_2_;
      auVar25._3_12_ = SUB1512(auVar51 << 0x20,3);
      auVar8[0xd] = 0;
      auVar8._0_13_ = auVar4._0_13_;
      auVar8[0xe] = auVar4[7];
      auVar11[0xc] = auVar4[6];
      auVar11._0_12_ = auVar4._0_12_;
      auVar11._13_2_ = auVar8._13_2_;
      auVar14[0xb] = 0;
      auVar14._0_11_ = auVar4._0_11_;
      auVar14._12_3_ = auVar11._12_3_;
      auVar17[10] = auVar4[5];
      auVar17._0_10_ = auVar4._0_10_;
      auVar17._11_4_ = auVar14._11_4_;
      auVar20[9] = 0;
      auVar20._0_9_ = auVar4._0_9_;
      auVar20._10_5_ = auVar17._10_5_;
      auVar23[8] = auVar4[4];
      auVar23._0_8_ = auVar4._0_8_;
      auVar23._9_6_ = auVar20._9_6_;
      auVar45._7_8_ = 0;
      auVar45._0_7_ = auVar23._8_7_;
      Var46 = CONCAT81(SUB158(auVar45 << 0x40,7),auVar4[3]);
      auVar52._9_6_ = 0;
      auVar52._0_9_ = Var46;
      auVar47._1_10_ = SUB1510(auVar52 << 0x30,5);
      auVar47[0] = auVar4[2];
      auVar53._11_4_ = 0;
      auVar53._0_11_ = auVar47;
      auVar26[2] = auVar4[1];
      auVar26._0_2_ = auVar4._0_2_;
      auVar26._3_12_ = SUB1512(auVar53 << 0x20,3);
      sVar69 = ((auVar5._0_2_ & 0xff) + (auVar3._0_2_ & 0xff)) - (auVar4._0_2_ & 0xff);
      sVar70 = (auVar25._2_2_ + auVar24._2_2_) - auVar26._2_2_;
      sVar71 = (auVar44._0_2_ + auVar41._0_2_) - auVar47._0_2_;
      sVar72 = ((short)Var43 + (short)Var40) - (short)Var46;
      sVar73 = (auVar22._8_2_ + auVar21._8_2_) - auVar23._8_2_;
      sVar74 = (auVar16._10_2_ + auVar15._10_2_) - auVar17._10_2_;
      sVar75 = (auVar10._12_2_ + auVar9._12_2_) - auVar11._12_2_;
      sVar76 = ((auVar7._13_2_ >> 8) + (auVar6._13_2_ >> 8)) - (auVar8._13_2_ >> 8);
      sVar61 = ((ushort)auVar5[8] + (ushort)auVar3[8]) - (ushort)auVar4[8];
      sVar62 = ((ushort)auVar5[9] + (ushort)auVar3[9]) - (ushort)auVar4[9];
      sVar63 = ((ushort)auVar5[10] + (ushort)auVar3[10]) - (ushort)auVar4[10];
      sVar64 = ((ushort)auVar5[0xb] + (ushort)auVar3[0xb]) - (ushort)auVar4[0xb];
      sVar65 = ((ushort)auVar5[0xc] + (ushort)auVar3[0xc]) - (ushort)auVar4[0xc];
      sVar66 = ((ushort)auVar5[0xd] + (ushort)auVar3[0xd]) - (ushort)auVar4[0xd];
      sVar67 = ((ushort)auVar5[0xe] + (ushort)auVar3[0xe]) - (ushort)auVar4[0xe];
      sVar68 = ((ushort)auVar5[0xf] + (ushort)auVar3[0xf]) - (ushort)auVar4[0xf];
      puVar2 = out + uVar59;
      *(char *)puVar2 =
           (char)*puVar1 - ((0 < sVar69) * (sVar69 < 0x100) * (char)sVar69 - (0xff < sVar69));
      *(char *)((long)puVar2 + 1) =
           cVar27 - ((0 < sVar70) * (sVar70 < 0x100) * (char)sVar70 - (0xff < sVar70));
      *(char *)((long)puVar2 + 2) =
           cVar28 - ((0 < sVar71) * (sVar71 < 0x100) * (char)sVar71 - (0xff < sVar71));
      *(char *)((long)puVar2 + 3) =
           cVar29 - ((0 < sVar72) * (sVar72 < 0x100) * (char)sVar72 - (0xff < sVar72));
      *(char *)(puVar2 + 1) =
           (char)uVar54 - ((0 < sVar73) * (sVar73 < 0x100) * (char)sVar73 - (0xff < sVar73));
      *(char *)((long)puVar2 + 5) =
           cVar30 - ((0 < sVar74) * (sVar74 < 0x100) * (char)sVar74 - (0xff < sVar74));
      *(char *)((long)puVar2 + 6) =
           cVar31 - ((0 < sVar75) * (sVar75 < 0x100) * (char)sVar75 - (0xff < sVar75));
      *(char *)((long)puVar2 + 7) =
           cVar32 - ((0 < sVar76) * (sVar76 < 0x100) * (char)sVar76 - (0xff < sVar76));
      *(char *)(puVar2 + 2) =
           (char)uVar55 - ((0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61));
      *(char *)((long)puVar2 + 9) =
           cVar33 - ((0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62));
      *(char *)((long)puVar2 + 10) =
           cVar34 - ((0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63));
      *(char *)((long)puVar2 + 0xb) =
           cVar35 - ((0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64));
      *(char *)(puVar2 + 3) =
           (char)uVar56 - ((0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65));
      *(char *)((long)puVar2 + 0xd) =
           cVar36 - ((0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66));
      *(char *)((long)puVar2 + 0xe) =
           cVar37 - ((0 < sVar67) * (sVar67 < 0x100) * (char)sVar67 - (0xff < sVar67));
      *(char *)((long)puVar2 + 0xf) =
           cVar38 - ((0 < sVar68) * (sVar68 < 0x100) * (char)sVar68 - (0xff < sVar68));
      uVar60 = uVar59 + 4;
      uVar58 = uVar59 + 8;
      uVar59 = uVar60;
    } while (uVar58 <= (uint)num_pixels);
  }
  iVar57 = num_pixels - (int)uVar60;
  if (iVar57 == 0) {
    return;
  }
  uVar60 = uVar60 & 0xffffffff;
  (*VP8LPredictorsSub_C[0xc])(in + uVar60,upper + uVar60,iVar57,out + uVar60);
  return;
}

Assistant:

static void PredictorSub12_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
    const __m128i L_hi = _mm_unpackhi_epi8(L, zero);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i T_hi = _mm_unpackhi_epi8(T, zero);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i TL_hi = _mm_unpackhi_epi8(TL, zero);
    const __m128i diff_lo = _mm_sub_epi16(T_lo, TL_lo);
    const __m128i diff_hi = _mm_sub_epi16(T_hi, TL_hi);
    const __m128i pred_lo = _mm_add_epi16(L_lo, diff_lo);
    const __m128i pred_hi = _mm_add_epi16(L_hi, diff_hi);
    const __m128i pred = _mm_packus_epi16(pred_lo, pred_hi);
    const __m128i res = _mm_sub_epi8(src, pred);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[12](in + i, upper + i, num_pixels - i, out + i);
  }
}